

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

uchar * __thiscall ON_WindowsBitmap::Bits(ON_WindowsBitmap *this,int scan_index)

{
  ON_WindowsBITMAPINFO *pOVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ON_WindowsRGBQUAD *local_38;
  uchar *bits;
  size_t sizeof_scan;
  int scan_index_local;
  ON_WindowsBitmap *this_local;
  
  iVar2 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1b])()
  ;
  if (this->m_bmi == (ON_WindowsBITMAPINFO *)0x0) {
    local_38 = (ON_WindowsRGBQUAD *)0x0;
  }
  else {
    pOVar1 = this->m_bmi;
    iVar3 = PaletteColorCount(this);
    local_38 = pOVar1->bmiColors + iVar3;
  }
  if ((((local_38 != (ON_WindowsRGBQUAD *)0x0) && (CONCAT44(extraout_var,iVar2) != 0)) &&
      (-1 < scan_index)) &&
     (iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object
                [0x19])(), scan_index < iVar3)) {
    return &local_38->rgbBlue + CONCAT44(extraout_var,iVar2) * (long)scan_index;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char* ON_WindowsBitmap::Bits(int scan_index) const
{
  const size_t sizeof_scan = SizeofScan();
  const unsigned char* bits = m_bmi ? (const unsigned char*)&m_bmi->bmiColors[PaletteColorCount()] : 0;
  if ( bits && sizeof_scan && scan_index >= 0 && scan_index < Height() ) {
    bits += (sizeof_scan*scan_index);
  }
  else {
    bits = 0;
  }
  return bits;
}